

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Gia_Man_t *
Acb_NtkToGia(Acb_Ntk_t *p,Vec_Int_t *vSupp,Vec_Int_t *vNodes,Vec_Int_t *vRoots,Vec_Int_t *vDivs,
            Vec_Int_t *vTargets)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *vTemp;
  Gia_Man_t *pGVar4;
  int local_54;
  int iObj;
  int i;
  Vec_Int_t *vFanins;
  Gia_Man_t *pOne;
  Gia_Man_t *pNew;
  Vec_Int_t *vTargets_local;
  Vec_Int_t *vDivs_local;
  Vec_Int_t *vRoots_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vSupp_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_NtkObjNum(p);
  p_00 = Gia_ManStart(iVar1 * 2 + 1000);
  pcVar3 = Acb_NtkName(p);
  pcVar3 = Abc_UtilStrsav(pcVar3);
  p_00->pName = pcVar3;
  Gia_ManHashAlloc(p_00);
  Acb_NtkCleanObjCopies(p);
  for (local_54 = 0; iVar1 = Vec_IntSize(vSupp), local_54 < iVar1; local_54 = local_54 + 1) {
    iVar1 = Vec_IntEntry(vSupp,local_54);
    iVar1 = Acb_NtkCi(p,iVar1);
    iVar2 = Gia_ManAppendCi(p_00);
    Acb_ObjSetCopy(p,iVar1,iVar2);
  }
  if (vTargets != (Vec_Int_t *)0x0) {
    for (local_54 = 0; iVar1 = Vec_IntSize(vTargets), local_54 < iVar1; local_54 = local_54 + 1) {
      iVar1 = Vec_IntEntry(vTargets,local_54);
      iVar2 = Gia_ManAppendCi(p_00);
      Acb_ObjSetCopy(p,iVar1,iVar2);
    }
  }
  vTemp = Vec_IntAlloc(4);
  for (local_54 = 0; iVar1 = Vec_IntSize(vNodes), local_54 < iVar1; local_54 = local_54 + 1) {
    iVar1 = Vec_IntEntry(vNodes,local_54);
    iVar2 = Acb_ObjCopy(p,iVar1);
    if (iVar2 == -1) {
      iVar2 = Acb_ObjToGia(p_00,p,iVar1,vTemp);
      Acb_ObjSetCopy(p,iVar1,iVar2);
    }
  }
  Vec_IntFree(vTemp);
  for (local_54 = 0; iVar1 = Vec_IntSize(vRoots), local_54 < iVar1; local_54 = local_54 + 1) {
    iVar1 = Vec_IntEntry(vRoots,local_54);
    iVar1 = Acb_NtkCo(p,iVar1);
    iVar1 = Acb_ObjFanin(p,iVar1,0);
    iVar1 = Acb_ObjCopy(p,iVar1);
    Gia_ManAppendCo(p_00,iVar1);
  }
  if (vDivs != (Vec_Int_t *)0x0) {
    iVar1 = Vec_IntSize(vDivs);
    iVar2 = Vec_IntSize(vSupp);
    if (iVar2 < iVar1) {
      for (local_54 = 0; iVar1 = Vec_IntSize(vDivs), local_54 < iVar1; local_54 = local_54 + 1) {
        iVar1 = Vec_IntEntry(vDivs,local_54);
        iVar1 = Acb_ObjCopy(p,iVar1);
        Gia_ManAppendCo(p_00,iVar1);
      }
    }
  }
  Gia_ManHashStop(p_00);
  pGVar4 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar4;
}

Assistant:

Gia_Man_t * Acb_NtkToGia( Acb_Ntk_t * p, Vec_Int_t * vSupp, Vec_Int_t * vNodes, Vec_Int_t * vRoots, Vec_Int_t * vDivs, Vec_Int_t * vTargets )
{
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins;
    int i, iObj;
    pNew = Gia_ManStart( 2 * Acb_NtkObjNum(p) + 1000 );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Gia_ManHashAlloc( pNew );
    Acb_NtkCleanObjCopies( p );
    // create primary inputs
    Acb_NtkForEachCiVec( vSupp, p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    // add targets as primary inputs
    if ( vTargets )
        Vec_IntForEachEntry( vTargets, iObj, i )
            Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    // bit-blast internal nodes
    vFanins = Vec_IntAlloc( 4 );
    Vec_IntForEachEntry( vNodes, iObj, i )
        if ( Acb_ObjCopy(p, iObj) == -1 ) // skip targets assigned above
            Acb_ObjSetCopy( p, iObj, Acb_ObjToGia(pNew, p, iObj, vFanins) );
    Vec_IntFree( vFanins );
    // create primary outputs
    Acb_NtkForEachCoDriverVec( vRoots, p, iObj, i )
        Gia_ManAppendCo( pNew, Acb_ObjCopy(p, iObj) );
    // add divisor as primary outputs (if the divisors are not primary inputs)
    if ( vDivs && Vec_IntSize(vDivs) > Vec_IntSize(vSupp) ) 
        Vec_IntForEachEntry( vDivs, iObj, i )
            Gia_ManAppendCo( pNew, Acb_ObjCopy(p, iObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}